

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3DropTable(Parse *pParse,SrcList *pName,int isView,int noErr)

{
  int iVar1;
  int iVar2;
  Parse *pParse_00;
  VTable *pVVar3;
  Vdbe *pTab_00;
  int in_ECX;
  int in_EDX;
  Parse *in_RDI;
  char *zArg2;
  char *zDb;
  char *zTab;
  int code;
  int iDb;
  sqlite3 *db;
  Vdbe *v;
  Table *pTab;
  sqlite3 *in_stack_ffffffffffffffa8;
  Parse *in_stack_ffffffffffffffb0;
  char *zName;
  SrcList *in_stack_ffffffffffffffb8;
  char *in_stack_ffffffffffffffc0;
  undefined4 uVar4;
  sqlite3 *db_00;
  Parse *pParse_01;
  
  pParse_01 = (Parse *)&DAT_aaaaaaaaaaaaaaaa;
  db_00 = in_RDI->db;
  if ((db_00->mallocFailed == '\0') &&
     (iVar1 = sqlite3ReadSchema(in_stack_ffffffffffffffb0), iVar1 == 0)) {
    if (in_ECX != 0) {
      db_00->suppressErr = db_00->suppressErr + '\x01';
    }
    pParse_00 = (Parse *)sqlite3LocateTableItem
                                   ((Parse *)in_stack_ffffffffffffffc0,
                                    (u32)((ulong)in_stack_ffffffffffffffb8 >> 0x20),
                                    (SrcItem *)in_stack_ffffffffffffffb0);
    if (in_ECX != 0) {
      db_00->suppressErr = db_00->suppressErr + 0xff;
    }
    if (pParse_00 == (Parse *)0x0) {
      if (in_ECX != 0) {
        sqlite3CodeVerifyNamedSchema
                  ((Parse *)in_stack_ffffffffffffffc0,(char *)in_stack_ffffffffffffffb8);
        sqlite3ForceNotReadOnly(in_stack_ffffffffffffffb0);
      }
    }
    else {
      iVar1 = sqlite3SchemaToIndex(db_00,(Schema *)pParse_00->pIdxEpr);
      if ((*(u8 *)((long)&pParse_00->nMem + 3) != '\x01') ||
         (iVar2 = sqlite3ViewGetColumnNames((Parse *)in_stack_ffffffffffffffa8,(Table *)0x1b1558),
         iVar2 == 0)) {
        in_stack_ffffffffffffffc0 = "sqlite_master";
        if (iVar1 == 1) {
          in_stack_ffffffffffffffc0 = "sqlite_temp_master";
        }
        in_stack_ffffffffffffffb8 = (SrcList *)db_00->aDb[iVar1].zDbSName;
        zName = (char *)0x0;
        iVar2 = sqlite3AuthCheck(pParse_01,(int)((ulong)db_00 >> 0x20),
                                 (char *)CONCAT44(iVar1,0xaaaaaaaa),in_stack_ffffffffffffffc0,
                                 (char *)in_stack_ffffffffffffffb8);
        if (iVar2 == 0) {
          if (in_EDX == 0) {
            if (*(u8 *)((long)&pParse_00->nMem + 3) == '\x01') {
              uVar4 = 0x1e;
              pVVar3 = sqlite3GetVTable(db_00,(Table *)pParse_00);
              zName = pVVar3->pMod->zName;
            }
            else if (iVar1 == 1) {
              uVar4 = 0xd;
            }
            else {
              uVar4 = 0xb;
            }
          }
          else if (iVar1 == 1) {
            uVar4 = 0xf;
          }
          else {
            uVar4 = 0x11;
          }
          iVar2 = sqlite3AuthCheck(pParse_01,(int)((ulong)db_00 >> 0x20),
                                   (char *)CONCAT44(iVar1,uVar4),in_stack_ffffffffffffffc0,
                                   (char *)in_stack_ffffffffffffffb8);
          if ((iVar2 == 0) &&
             (iVar2 = sqlite3AuthCheck(pParse_01,(int)((ulong)db_00 >> 0x20),
                                       (char *)CONCAT44(iVar1,uVar4),in_stack_ffffffffffffffc0,
                                       (char *)in_stack_ffffffffffffffb8), iVar2 == 0)) {
            iVar2 = tableMayNotBeDropped(in_stack_ffffffffffffffa8,(Table *)0x1b16ab);
            if (iVar2 == 0) {
              if ((in_EDX == 0) || (*(u8 *)((long)&pParse_00->nMem + 3) == '\x02')) {
                if ((in_EDX == 0) && (*(u8 *)((long)&pParse_00->nMem + 3) == '\x02')) {
                  sqlite3ErrorMsg(in_RDI,"use DROP VIEW to delete view %s",pParse_00->db);
                }
                else {
                  pTab_00 = sqlite3GetVdbe((Parse *)in_stack_ffffffffffffffa8);
                  if (pTab_00 != (Vdbe *)0x0) {
                    sqlite3BeginWriteOperation
                              ((Parse *)in_stack_ffffffffffffffc0,
                               (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20),
                               (int)in_stack_ffffffffffffffb8);
                    if (in_EDX == 0) {
                      sqlite3ClearStatTables
                                ((Parse *)CONCAT44(iVar1,uVar4),
                                 (int)((ulong)in_stack_ffffffffffffffc0 >> 0x20),
                                 (char *)in_stack_ffffffffffffffb8,zName);
                      sqlite3FkDropTable(pParse_00,(SrcList *)pTab_00,(Table *)db_00);
                    }
                    sqlite3CodeDropTable
                              (pParse_00,(Table *)pTab_00,(int)((ulong)db_00 >> 0x20),(int)db_00);
                  }
                }
              }
              else {
                sqlite3ErrorMsg(in_RDI,"use DROP TABLE to delete table %s",pParse_00->db);
              }
            }
            else {
              sqlite3ErrorMsg(in_RDI,"table %s may not be dropped",pParse_00->db);
            }
          }
        }
      }
    }
  }
  sqlite3SrcListDelete((sqlite3 *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3DropTable(Parse *pParse, SrcList *pName, int isView, int noErr){
  Table *pTab;
  Vdbe *v;
  sqlite3 *db = pParse->db;
  int iDb;

  if( db->mallocFailed ){
    goto exit_drop_table;
  }
  assert( pParse->nErr==0 );
  assert( pName->nSrc==1 );
  assert( pName->a[0].fg.fixedSchema==0 );
  assert( pName->a[0].fg.isSubquery==0 );
  if( sqlite3ReadSchema(pParse) ) goto exit_drop_table;
  if( noErr ) db->suppressErr++;
  assert( isView==0 || isView==LOCATE_VIEW );
  pTab = sqlite3LocateTableItem(pParse, isView, &pName->a[0]);
  if( noErr ) db->suppressErr--;

  if( pTab==0 ){
    if( noErr ){
      sqlite3CodeVerifyNamedSchema(pParse, pName->a[0].u4.zDatabase);
      sqlite3ForceNotReadOnly(pParse);
    }
    goto exit_drop_table;
  }
  iDb = sqlite3SchemaToIndex(db, pTab->pSchema);
  assert( iDb>=0 && iDb<db->nDb );

  /* If pTab is a virtual table, call ViewGetColumnNames() to ensure
  ** it is initialized.
  */
  if( IsVirtual(pTab) && sqlite3ViewGetColumnNames(pParse, pTab) ){
    goto exit_drop_table;
  }
#ifndef SQLITE_OMIT_AUTHORIZATION
  {
    int code;
    const char *zTab = SCHEMA_TABLE(iDb);
    const char *zDb = db->aDb[iDb].zDbSName;
    const char *zArg2 = 0;
    if( sqlite3AuthCheck(pParse, SQLITE_DELETE, zTab, 0, zDb)){
      goto exit_drop_table;
    }
    if( isView ){
      if( !OMIT_TEMPDB && iDb==1 ){
        code = SQLITE_DROP_TEMP_VIEW;
      }else{
        code = SQLITE_DROP_VIEW;
      }
#ifndef SQLITE_OMIT_VIRTUALTABLE
    }else if( IsVirtual(pTab) ){
      code = SQLITE_DROP_VTABLE;
      zArg2 = sqlite3GetVTable(db, pTab)->pMod->zName;
#endif
    }else{
      if( !OMIT_TEMPDB && iDb==1 ){
        code = SQLITE_DROP_TEMP_TABLE;
      }else{
        code = SQLITE_DROP_TABLE;
      }
    }
    if( sqlite3AuthCheck(pParse, code, pTab->zName, zArg2, zDb) ){
      goto exit_drop_table;
    }
    if( sqlite3AuthCheck(pParse, SQLITE_DELETE, pTab->zName, 0, zDb) ){
      goto exit_drop_table;
    }
  }
#endif
  if( tableMayNotBeDropped(db, pTab) ){
    sqlite3ErrorMsg(pParse, "table %s may not be dropped", pTab->zName);
    goto exit_drop_table;
  }

#ifndef SQLITE_OMIT_VIEW
  /* Ensure DROP TABLE is not used on a view, and DROP VIEW is not used
  ** on a table.
  */
  if( isView && !IsView(pTab) ){
    sqlite3ErrorMsg(pParse, "use DROP TABLE to delete table %s", pTab->zName);
    goto exit_drop_table;
  }
  if( !isView && IsView(pTab) ){
    sqlite3ErrorMsg(pParse, "use DROP VIEW to delete view %s", pTab->zName);
    goto exit_drop_table;
  }
#endif

  /* Generate code to remove the table from the schema table
  ** on disk.
  */
  v = sqlite3GetVdbe(pParse);
  if( v ){
    sqlite3BeginWriteOperation(pParse, 1, iDb);
    if( !isView ){
      sqlite3ClearStatTables(pParse, iDb, "tbl", pTab->zName);
      sqlite3FkDropTable(pParse, pName, pTab);
    }
    sqlite3CodeDropTable(pParse, pTab, iDb, isView);
  }

exit_drop_table:
  sqlite3SrcListDelete(db, pName);
}